

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::is_builtin_type(Compiler *this,SPIRType *type)

{
  Meta *pMVar1;
  Decoration *pDVar2;
  Decoration *m;
  Decoration *__end2;
  Decoration *__begin2;
  Vector<Decoration> *__range2;
  Meta *type_meta;
  SPIRType *type_local;
  Compiler *this_local;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if (pMVar1 != (Meta *)0x0) {
    __end2 = VectorView<spirv_cross::Meta::Decoration>::begin
                       (&(pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>);
    pDVar2 = VectorView<spirv_cross::Meta::Decoration>::end
                       (&(pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>);
    for (; __end2 != pDVar2; __end2 = __end2 + 1) {
      if ((__end2->builtin & 1U) != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Compiler::is_builtin_type(const SPIRType &type) const
{
	auto *type_meta = ir.find_meta(type.self);

	// We can have builtin structs as well. If one member of a struct is builtin, the struct must also be builtin.
	if (type_meta)
		for (auto &m : type_meta->members)
			if (m.builtin)
				return true;

	return false;
}